

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resources.h
# Opt level: O0

void __thiscall Resources::Resources(Resources *this,path *project_root)

{
  path *project_root_local;
  Resources *this_local;
  
  std::experimental::filesystem::v1::__cxx11::path::path(&this->project_root_,project_root);
  this->shader_include_guard_ = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledShaderSource>_>_>_>
  ::map(&this->shader_sources_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledFile>_>_>_>
  ::map(&this->files_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledTexture>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PolledTexture>_>_>_>
  ::map(&this->textures_);
  return;
}

Assistant:

Resources(const fs::path &project_root) : project_root_(project_root) {}